

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O3

void __thiscall Imf_3_4::AcesInputFile::readPixels(AcesInputFile *this,int scanLine1,int scanLine2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int iVar19;
  int iVar20;
  Data *pDVar21;
  size_t sVar22;
  size_t sVar23;
  char cVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  uint16_t uVar29;
  float fVar30;
  float fVar31;
  uint uVar32;
  half *phVar33;
  half *phVar34;
  float fVar35;
  float fVar36;
  
  RgbaInputFile::readPixels(this->_data->rgbaFile,scanLine1,scanLine2);
  lVar25 = _imath_half_to_float_table;
  pDVar21 = this->_data;
  if (pDVar21->mustConvertColor == true) {
    iVar26 = scanLine1;
    if (scanLine2 < scanLine1) {
      iVar26 = scanLine2;
    }
    sVar22 = pDVar21->fbXStride;
    iVar19 = pDVar21->minX;
    sVar23 = pDVar21->fbYStride;
    iVar20 = pDVar21->maxX;
    lVar28 = (long)iVar26;
    phVar33 = &pDVar21->fbBase[sVar23 * lVar28 + (long)iVar19 * sVar22].b;
    do {
      if (iVar19 <= iVar20) {
        fVar1 = (pDVar21->fileToAces).x[0][1];
        fVar2 = (pDVar21->fileToAces).x[1][1];
        fVar3 = (pDVar21->fileToAces).x[2][1];
        fVar4 = (pDVar21->fileToAces).x[3][1];
        fVar5 = (pDVar21->fileToAces).x[0][2];
        fVar6 = (pDVar21->fileToAces).x[1][2];
        fVar7 = (pDVar21->fileToAces).x[2][2];
        fVar8 = (pDVar21->fileToAces).x[3][2];
        fVar9 = (pDVar21->fileToAces).x[3][3];
        fVar10 = (pDVar21->fileToAces).x[3][0];
        fVar11 = (pDVar21->fileToAces).x[2][3];
        fVar12 = (pDVar21->fileToAces).x[2][0];
        fVar13 = (pDVar21->fileToAces).x[0][3];
        fVar14 = (pDVar21->fileToAces).x[0][0];
        fVar15 = (pDVar21->fileToAces).x[1][3];
        fVar16 = (pDVar21->fileToAces).x[1][0];
        phVar34 = phVar33;
        iVar27 = (iVar20 - iVar19) + 1;
        do {
          fVar31 = *(float *)(lVar25 + (ulong)(((Rgba *)(phVar34 + -2))->r)._h * 4);
          fVar17 = *(float *)(lVar25 + (ulong)phVar34[-1]._h * 4);
          fVar18 = *(float *)(lVar25 + (ulong)phVar34->_h * 4);
          fVar36 = fVar18 * fVar11 + fVar31 * fVar13 + fVar17 * fVar15 + fVar9;
          fVar35 = (fVar18 * fVar12 + fVar31 * fVar14 + fVar17 * fVar16 + fVar10) / fVar36;
          fVar30 = ABS(fVar35);
          uVar29 = (ushort)((uint)fVar35 >> 0x10) & 0x8000;
          if ((uint)fVar30 < 0x38800000) {
            if ((0x33000000 < (uint)fVar30) &&
               (uVar32 = (uint)fVar30 & 0x7fffff | 0x800000, cVar24 = (char)((uint)fVar30 >> 0x17),
               uVar29 = uVar29 | (ushort)(uVar32 >> (0x7eU - cVar24 & 0x1f)),
               0x80000000 < uVar32 << (cVar24 + 0xa2U & 0x1f))) {
              uVar29 = uVar29 + 1;
            }
          }
          else if ((uint)fVar30 < 0x7f800000) {
            if ((uint)fVar30 < 0x477ff000) {
              uVar29 = (ushort)((int)fVar30 + 0x8000fff + (uint)(((uint)fVar30 >> 0xd & 1) != 0) >>
                               0xd) | uVar29;
            }
            else {
              uVar29 = uVar29 | 0x7c00;
            }
          }
          else {
            uVar29 = uVar29 | 0x7c00;
            if (fVar30 != INFINITY) {
              uVar32 = (uint)fVar30 >> 0xd & 0x3ff;
              uVar29 = uVar29 | (ushort)uVar32 | (ushort)(uVar32 == 0);
            }
          }
          fVar35 = (fVar18 * fVar3 + fVar31 * fVar1 + fVar17 * fVar2 + fVar4) / fVar36;
          (((Rgba *)(phVar34 + -2))->r)._h = uVar29;
          fVar30 = ABS(fVar35);
          uVar29 = (ushort)((uint)fVar35 >> 0x10) & 0x8000;
          if ((uint)fVar30 < 0x38800000) {
            if ((0x33000000 < (uint)fVar30) &&
               (uVar32 = (uint)fVar30 & 0x7fffff | 0x800000, cVar24 = (char)((uint)fVar30 >> 0x17),
               uVar29 = uVar29 | (ushort)(uVar32 >> (0x7eU - cVar24 & 0x1f)),
               0x80000000 < uVar32 << (cVar24 + 0xa2U & 0x1f))) {
              uVar29 = uVar29 + 1;
            }
          }
          else if ((uint)fVar30 < 0x7f800000) {
            if ((uint)fVar30 < 0x477ff000) {
              uVar29 = (ushort)((int)fVar30 + 0x8000fff + (uint)(((uint)fVar30 >> 0xd & 1) != 0) >>
                               0xd) | uVar29;
            }
            else {
              uVar29 = uVar29 | 0x7c00;
            }
          }
          else {
            uVar29 = uVar29 | 0x7c00;
            if (fVar30 != INFINITY) {
              uVar32 = (uint)fVar30 >> 0xd & 0x3ff;
              uVar29 = uVar29 | (ushort)uVar32 | (ushort)(uVar32 == 0);
            }
          }
          fVar36 = (fVar18 * fVar7 + fVar31 * fVar5 + fVar17 * fVar6 + fVar8) / fVar36;
          phVar34[-1]._h = uVar29;
          fVar31 = ABS(fVar36);
          uVar29 = (ushort)((uint)fVar36 >> 0x10) & 0x8000;
          if ((uint)fVar31 < 0x38800000) {
            if ((0x33000000 < (uint)fVar31) &&
               (uVar32 = (uint)fVar31 & 0x7fffff | 0x800000, cVar24 = (char)((uint)fVar31 >> 0x17),
               uVar29 = uVar29 | (ushort)(uVar32 >> (0x7eU - cVar24 & 0x1f)),
               0x80000000 < uVar32 << (cVar24 + 0xa2U & 0x1f))) {
              uVar29 = uVar29 + 1;
            }
          }
          else if ((uint)fVar31 < 0x7f800000) {
            if ((uint)fVar31 < 0x477ff000) {
              uVar29 = (ushort)((int)fVar31 + 0x8000fff + (uint)(((uint)fVar31 >> 0xd & 1) != 0) >>
                               0xd) | uVar29;
            }
            else {
              uVar29 = uVar29 | 0x7c00;
            }
          }
          else {
            uVar29 = uVar29 | 0x7c00;
            if (fVar31 != INFINITY) {
              uVar32 = (uint)fVar31 >> 0xd & 0x3ff;
              uVar29 = uVar29 | (ushort)uVar32 | (ushort)(uVar32 == 0);
            }
          }
          phVar34->_h = uVar29;
          phVar34 = phVar34 + sVar22 * 4;
          iVar27 = iVar27 + -1;
        } while (iVar27 != 0);
      }
      lVar28 = lVar28 + 1;
      phVar33 = phVar33 + sVar23 * 4;
    } while (((scanLine1 + scanLine2) - iVar26) + 1 != (int)lVar28);
  }
  return;
}

Assistant:

void
AcesInputFile::readPixels (int scanLine1, int scanLine2)
{
    //
    // Copy the pixels from the RgbaInputFile into the frame buffer.
    //

    _data->rgbaFile->readPixels (scanLine1, scanLine2);

    //
    // If the RGB space of the input file is not the same as the ACES
    // RGB space, then the pixels in the frame buffer must be transformed
    // into the ACES RGB space.
    //

    if (!_data->mustConvertColor) return;

    int minY = min (scanLine1, scanLine2);
    int maxY = max (scanLine1, scanLine2);

    for (int y = minY; y <= maxY; ++y)
    {
        Rgba* base = _data->fbBase + _data->fbXStride * _data->minX +
                     _data->fbYStride * y;

        for (int x = _data->minX; x <= _data->maxX; ++x)
        {
            V3f aces = V3f (base->r, base->g, base->b) * _data->fileToAces;

            base->r = aces[0];
            base->g = aces[1];
            base->b = aces[2];

            base += _data->fbXStride;
        }
    }
}